

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O3

void __thiscall
pbrt::SurfaceInteraction::SkipIntersection(SurfaceInteraction *this,RayDifferential *ray,Float t)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined8 uVar7;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  RayDifferential local_70;
  
  Interaction::SpawnRay(&local_70,&this->super_Interaction,&(ray->super_Ray).d);
  (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x =
       local_70.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x;
  (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
       local_70.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.y;
  *(undefined8 *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
       local_70.super_Ray._20_8_;
  (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x =
       local_70.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x;
  (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y =
       local_70.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y;
  *(ulong *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
       CONCAT44(local_70.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x,
                local_70.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z);
  (ray->super_Ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (uintptr_t)
          local_70.super_Ray.medium.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  if (ray->hasDifferentials == true) {
    uVar3 = (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar8 = (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar4 = (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x;
    uVar9 = (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y;
    uVar5 = (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x;
    uVar10 = (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y;
    uVar6 = (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar11 = (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y;
    fVar1 = (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z;
    fVar2 = (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z;
    auVar13._0_4_ = (float)uVar3 * t + (float)uVar4;
    auVar13._4_4_ = (float)uVar8 * t + (float)uVar9;
    auVar13._8_4_ = t * 0.0 + 0.0;
    auVar13._12_4_ = t * 0.0 + 0.0;
    auVar12._0_4_ = (float)uVar6 * t + (float)uVar5;
    auVar12._4_4_ = (float)uVar11 * t + (float)uVar10;
    auVar12._8_4_ = t * 0.0 + 0.0;
    auVar12._12_4_ = t * 0.0 + 0.0;
    uVar7 = vmovlps_avx(auVar13);
    (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar7;
    (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar7 >> 0x20);
    (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z = t * fVar1 + fVar2;
    fVar1 = (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z;
    fVar2 = (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z;
    uVar7 = vmovlps_avx(auVar12);
    (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar7;
    (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar7 >> 0x20);
    (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z = t * fVar1 + fVar2;
  }
  return;
}

Assistant:

void SurfaceInteraction::SkipIntersection(RayDifferential *ray, Float t) const {
    *((Ray *)ray) = SpawnRay(ray->d);
    if (ray->hasDifferentials) {
        ray->rxOrigin = ray->rxOrigin + t * ray->rxDirection;
        ray->ryOrigin = ray->ryOrigin + t * ray->ryDirection;
    }
}